

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O2

uint32_t c_u32_load_unaligned(void *p)

{
  int c;
  long lVar1;
  uint32_t t;
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    *(undefined1 *)((long)&t + lVar1) = *(undefined1 *)((long)p + lVar1);
  }
  return t;
}

Assistant:

SIMD_INLINE uint32_t c_u32_load_unaligned(const void *p) {
  uint32_t t;
  uint8_t *pp = (uint8_t *)p;
  uint8_t *q = (uint8_t *)&t;
  int c;
  for (c = 0; c < 4; c++) q[c] = pp[c];
  return t;
}